

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestStreamWriterTestwriteZeroes::runTestCase(TestStreamWriterTestwriteZeroes *this)

{
  TestResult *pTVar1;
  Value *pVVar2;
  char *pcVar3;
  string out;
  string local_138;
  Value root;
  string local_f0;
  string binary;
  string expected;
  StreamWriterBuilder b;
  Value local_60;
  Value local_38;
  
  binary._M_dataplus._M_p = (pointer)&binary.field_2;
  binary.field_2._M_allocated_capacity._0_4_ = 0x6968;
  binary._M_string_length = 3;
  JsonTest::checkEqual<int,unsigned_long>
            ((this->super_StreamWriterTest).super_TestCase.result_,3,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x6b3,"3 == binary.length()");
  std::__cxx11::string::string((string *)&expected,"\"hi\\u0000\"",(allocator *)&b);
  Json::StreamWriterBuilder::StreamWriterBuilder(&b);
  Json::Value::Value(&root,nullValue);
  Json::Value::Value(&local_38,&binary);
  Json::Value::operator=(&root,&local_38);
  Json::Value::~Value(&local_38);
  pTVar1 = (this->super_StreamWriterTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&out,(string *)&binary);
  Json::Value::asString_abi_cxx11_(&local_138,&root);
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar1,&out,&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x6b9,"binary == root.asString()");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&out);
  Json::writeString_abi_cxx11_(&out,(Json *)&b,(Factory *)&root,(Value *)pcVar3);
  JsonTest::checkEqual<unsigned_long,unsigned_long>
            ((this->super_StreamWriterTest).super_TestCase.result_,expected._M_string_length,
             out._M_string_length,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x6bb,"expected.size() == out.size()");
  pTVar1 = (this->super_StreamWriterTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_138,(string *)&expected);
  std::__cxx11::string::string((string *)&local_f0,(string *)&out);
  JsonTest::checkStringEqual
            (pTVar1,&local_138,&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x6bc,"expected == out");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&out);
  Json::Value::~Value(&root);
  Json::Value::Value(&root,nullValue);
  Json::Value::Value(&local_60,&binary);
  pVVar2 = Json::Value::operator[](&root,"top");
  Json::Value::operator=(pVVar2,&local_60);
  Json::Value::~Value(&local_60);
  pTVar1 = (this->super_StreamWriterTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&out,(string *)&binary);
  pVVar2 = Json::Value::operator[](&root,"top");
  Json::Value::asString_abi_cxx11_(&local_138,pVVar2);
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar1,&out,&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x6c1,"binary == root[\"top\"].asString()");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&out);
  pVVar2 = Json::Value::operator[](&root,"top");
  Json::writeString_abi_cxx11_(&out,(Json *)&b,(Factory *)pVVar2,(Value *)pcVar3);
  pTVar1 = (this->super_StreamWriterTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_138,(string *)&expected);
  std::__cxx11::string::string((string *)&local_f0,(string *)&out);
  JsonTest::checkStringEqual
            (pTVar1,&local_138,&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x6c3,"expected == out");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&out);
  Json::Value::~Value(&root);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&b);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&binary);
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, writeZeroes) {
  std::string binary("hi", 3);  // include trailing 0
  JSONTEST_ASSERT_EQUAL(3, binary.length());
  std::string expected("\"hi\\u0000\"");  // unicoded zero
  Json::StreamWriterBuilder b;
  {
    Json::Value root;
    root = binary;
    JSONTEST_ASSERT_STRING_EQUAL(binary, root.asString());
    std::string out = Json::writeString(b, root);
    JSONTEST_ASSERT_EQUAL(expected.size(), out.size());
    JSONTEST_ASSERT_STRING_EQUAL(expected, out);
  }
  {
    Json::Value root;
    root["top"] = binary;
    JSONTEST_ASSERT_STRING_EQUAL(binary, root["top"].asString());
    std::string out = Json::writeString(b, root["top"]);
    JSONTEST_ASSERT_STRING_EQUAL(expected, out);
  }
}